

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QColorListView.cpp
# Opt level: O0

QList<QColor> * __thiscall QColorListView::selectedColors(QColorListView *this)

{
  bool bVar1;
  QModelIndex *this_00;
  QModelIndex *in_RDI;
  QModelIndex *index;
  QForeachContainer<QList<QModelIndex>_> _container_102;
  QModelIndexList indexes;
  QList<QColor> *colors;
  rvalue_ref in_stack_ffffffffffffff08;
  undefined7 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1f;
  QModelIndex *this_01;
  QVariant local_c8 [2];
  QModelIndex *local_80;
  QModelIndex *local_78;
  const_iterator local_48;
  const_iterator local_40;
  undefined1 local_29;
  undefined1 local_28 [40];
  
  this_01 = in_RDI;
  QAbstractItemView::selectionModel();
  QItemSelectionModel::selectedRows((int)local_28);
  local_29 = 0;
  QList<QColor>::QList((QList<QColor> *)0x21851a);
  QtPrivate::qMakeForeachContainer<QList<QModelIndex>const&>
            ((QList<QModelIndex> *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
  while( true ) {
    local_78 = local_40.i;
    bVar1 = QList<QModelIndex>::const_iterator::operator!=(&local_48,local_40);
    if (!bVar1) break;
    this_00 = QList<QModelIndex>::const_iterator::operator*(&local_48);
    local_80 = this_00;
    QModelIndex::data(this_01,(int)((ulong)in_RDI >> 0x20));
    QVariant::toString();
    QColor::QColor((QColor *)this_00,(QString *)in_stack_ffffffffffffff08);
    QList<QColor>::operator<<((QList<QColor> *)this_00,in_stack_ffffffffffffff08);
    QString::~QString((QString *)0x21861a);
    QVariant::~QVariant(local_c8);
    QList<QModelIndex>::const_iterator::operator++(&local_48);
  }
  QtPrivate::QForeachContainer<QList<QModelIndex>_>::~QForeachContainer
            ((QForeachContainer<QList<QModelIndex>_> *)0x218572);
  local_29 = 1;
  QList<QModelIndex>::~QList((QList<QModelIndex> *)0x2186ae);
  return (QList<QColor> *)in_RDI;
}

Assistant:

QList<QColor> QColorListView::selectedColors() const {
    const QModelIndexList indexes = selectionModel()->selectedRows();
    QList<QColor> colors;

    foreach (const QModelIndex &index, indexes) {
        colors << QColor(index.data(static_cast<int>(QColorListModel::Role::HexArgbName)).toString());
    }

    return colors;
}